

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

FIOBJ fiobj_str_tmp(void)

{
  long *in_FS_OFFSET;
  fio_str_info_s local_20;
  
  *(undefined1 *)(*in_FS_OFFSET + -0x2e7) = 0;
  fio_str_resize(&local_20,(fio_str_s_conflict *)(*in_FS_OFFSET + -0x2e8),0);
  return *in_FS_OFFSET - 0x2f8U | 2;
}

Assistant:

FIOBJ fiobj_str_tmp(void) {
  static __thread fiobj_str_s tmp = {
      .head =
          {
              .ref = ((~(uint32_t)0) >> 4),
              .type = FIOBJ_T_STRING,
          },
      .str = {.small = 1},
  };
  tmp.str.frozen = 0;
  fio_str_resize(&tmp.str, 0);
  return ((uintptr_t)&tmp | FIOBJECT_STRING_FLAG);
}